

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_audio.cpp
# Opt level: O0

void __thiscall cubeb_run_channel_rate_test_Test::TestBody(cubeb_run_channel_rate_test_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_;
  int freq;
  int *__end2;
  int *__begin2;
  int (*__range2) [4];
  uint channels;
  uint *__end1;
  uint *__begin1;
  uint (*__range1) [5];
  int freq_values [4];
  uint channel_values [5];
  undefined1 in_stack_fffffffffffffeff;
  AssertHelper in_stack_ffffffffffffff00;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff10;
  uint in_stack_ffffffffffffff14;
  char *in_stack_ffffffffffffff18;
  AssertHelper local_d8;
  Message local_d0;
  undefined4 local_c8;
  int local_c4;
  AssertionResult local_c0;
  uint local_ac;
  String local_a8;
  AssertHelper local_98;
  Message local_90;
  AssertionResult local_88;
  undefined4 local_74;
  undefined8 *local_70;
  undefined8 *local_68;
  undefined8 *local_60;
  undefined4 local_54;
  undefined8 *local_50;
  undefined8 *local_48;
  undefined8 *local_40;
  undefined8 local_38;
  undefined8 local_30;
  undefined8 local_28;
  undefined8 local_20;
  undefined4 local_18;
  undefined8 auStack_14 [2];
  
  local_28 = 0x200000001;
  local_20 = 0x400000003;
  local_18 = 6;
  local_38 = 0x5dc000003e80;
  local_30 = 0xbb800000ac44;
  local_48 = &local_28;
  local_50 = auStack_14;
  local_40 = local_48;
  do {
    if (local_48 == local_50) {
      return;
    }
    local_54 = *(undefined4 *)local_48;
    local_70 = &local_28;
    local_68 = &local_38;
    local_60 = local_68;
    for (; local_68 != local_70; local_68 = (undefined8 *)((long)local_68 + 4)) {
      local_74 = *(undefined4 *)local_68;
      testing::AssertionResult::AssertionResult
                ((AssertionResult *)in_stack_ffffffffffffff00.data_,(bool)in_stack_fffffffffffffeff)
      ;
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_88);
      if (!bVar1) {
        testing::Message::Message
                  ((Message *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
        testing::internal::GetBoolAssertionFailureMessage
                  ((internal *)&local_a8,&local_88,"channels < MAX_NUM_CHANNELS","false","true");
        pcVar2 = testing::internal::String::c_str(&local_a8);
        testing::internal::AssertHelper::AssertHelper
                  (&local_98,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/talonvoice[P]cubeb/test/test_audio.cpp"
                   ,0xee,pcVar2);
        testing::internal::AssertHelper::operator=(&local_98,&local_90);
        testing::internal::AssertHelper::~AssertHelper(&local_98);
        testing::internal::String::~String((String *)in_stack_ffffffffffffff00.data_);
        testing::Message::~Message((Message *)0x1352da);
      }
      local_ac = (uint)!bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x1352f9);
      if (local_ac != 0) {
        return;
      }
      fprintf(_stderr,"--------------------------\n");
      local_c4 = run_test((int)__range2,__begin2._4_4_,(int)__begin2);
      local_c8 = 0;
      testing::internal::EqHelper<false>::Compare<int,__0>
                (in_stack_ffffffffffffff18,
                 (char *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                 (int *)in_stack_ffffffffffffff08.ptr_,
                 (anon_enum_32 *)in_stack_ffffffffffffff00.data_);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_c0);
      if (!bVar1) {
        testing::Message::Message
                  ((Message *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x135389);
        testing::internal::AssertHelper::AssertHelper
                  (&local_d8,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/talonvoice[P]cubeb/test/test_audio.cpp"
                   ,0xf0,pcVar2);
        testing::internal::AssertHelper::operator=(&local_d8,&local_d0);
        testing::internal::AssertHelper::~AssertHelper(&local_d8);
        testing::Message::~Message((Message *)0x1353ca);
      }
      local_ac = (uint)!bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x1353e6);
      if (local_ac != 0) {
        return;
      }
      in_stack_ffffffffffffff14 = run_test((int)__range2,__begin2._4_4_,(int)__begin2);
      in_stack_ffffffffffffff10 = 0;
      testing::internal::EqHelper<false>::Compare<int,__0>
                (in_stack_ffffffffffffff18,(char *)((ulong)in_stack_ffffffffffffff14 << 0x20),
                 (int *)in_stack_ffffffffffffff08.ptr_,
                 (anon_enum_32 *)in_stack_ffffffffffffff00.data_);
      bVar1 = testing::AssertionResult::operator_cast_to_bool
                        ((AssertionResult *)&stack0xffffffffffffff18);
      if (!bVar1) {
        testing::Message::Message
                  ((Message *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x135461);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&stack0xffffffffffffff00,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/talonvoice[P]cubeb/test/test_audio.cpp"
                   ,0xf1,pcVar2);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&stack0xffffffffffffff00,(Message *)&stack0xffffffffffffff08);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffff00);
        testing::Message::~Message((Message *)0x1354a2);
      }
      local_ac = (uint)!bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x1354be);
      if (local_ac != 0) {
        return;
      }
    }
    local_48 = (undefined8 *)((long)local_48 + 4);
  } while( true );
}

Assistant:

TEST(cubeb, run_channel_rate_test)
{
  unsigned int channel_values[] = {
    1,
    2,
    3,
    4,
    6,
  };

  int freq_values[] = {
    16000,
    24000,
    44100,
    48000,
  };

  for(auto channels : channel_values) {
    for(auto freq : freq_values) {
      ASSERT_TRUE(channels < MAX_NUM_CHANNELS);
      fprintf(stderr, "--------------------------\n");
      ASSERT_EQ(run_test(channels, freq, 0), CUBEB_OK);
      ASSERT_EQ(run_test(channels, freq, 1), CUBEB_OK);
    }
  }
}